

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdatetimeedit.cpp
# Opt level: O2

void QTimeEdit::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined4 *puVar1;
  time_t tVar2;
  undefined4 in_register_00000034;
  time_t *__timer;
  
  __timer = (time_t *)CONCAT44(in_register_00000034,_c);
  if (_id == 0 && _c == InvokeMetaMethod) {
    __timer = (time_t *)(ulong)(uint)*_a[1];
    userTimeChanged((QTimeEdit *)_o,(QTime)*_a[1]);
  }
  if (_c == ReadProperty) {
    if (_id == 0) {
      puVar1 = (undefined4 *)*_a;
      tVar2 = QDateTimeEdit::time((QDateTimeEdit *)_o,__timer);
      *puVar1 = (int)tVar2;
    }
  }
  else if (_c == WriteProperty) {
    if (_id == 0) {
      QDateTimeEdit::setTime((QDateTimeEdit *)_o,(QTime)**_a);
      return;
    }
  }
  else if (_c == IndexOfMethod) {
    QtMocHelpers::indexOfMethod<void(QTimeEdit::*)(QTime)>
              ((QtMocHelpers *)_a,(void **)userTimeChanged,0,0);
    return;
  }
  return;
}

Assistant:

void QTimeEdit::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QTimeEdit *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->userTimeChanged((*reinterpret_cast< std::add_pointer_t<QTime>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QTimeEdit::*)(QTime )>(_a, &QTimeEdit::userTimeChanged, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QTime*>(_v) = _t->time(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setTime(*reinterpret_cast<QTime*>(_v)); break;
        default: break;
        }
    }
}